

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execMove0<(moira::Instr)71,(moira::Mode)11,(moira::Size)2>(Moira *this,u16 opcode)

{
  u32 uVar1;
  
  uVar1 = readI<(moira::Size)2>(this);
  (this->reg).sr.n = (bool)((byte)(uVar1 >> 0xf) & 1);
  (this->reg).sr.z = (short)uVar1 == 0;
  (this->reg).sr.v = false;
  (this->reg).sr.c = false;
  *(short *)((long)this->exec + (ulong)((opcode & 0xe00) >> 9) * 4 + -0x58) = (short)uVar1;
  prefetch<4ul>(this);
  return;
}

Assistant:

void
Moira::execMove0(u16 opcode)
{
    u32 ea, data;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    if (!readOp <M, S, STD_AE_FRAME> (src, ea, data)) return;

    reg.sr.n = NBIT<S>(data);
    reg.sr.z = ZERO<S>(data);
    reg.sr.v = 0;
    reg.sr.c = 0;

    if (!writeOp <MODE_DN, S> (dst, data)) return;

    prefetch<POLLIPL>();
}